

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin(TRANSPORT_LL_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  STRING_HANDLE pSVar2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  int result;
  TRANSPORT_LL_HANDLE handle_local;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin",0xd07,1,
                "Invalid handle parameter. NULL.");
    }
    transport_data._4_4_ = 0xd08;
  }
  else {
    if (*(long *)((long)handle + 0x10) == 0) {
      pSVar2 = STRING_construct(TOPIC_GET_DESIRED_STATE);
      *(STRING_HANDLE *)((long)handle + 0x10) = pSVar2;
      if (*(long *)((long)handle + 0x10) == 0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin",0xd11,1,
                    "Failure: unable constructing reported state topic");
        }
        transport_data._4_4_ = 0xd12;
      }
      else {
        *(uint *)((long)handle + 0x30) = *(uint *)((long)handle + 0x30) | 1;
        transport_data._4_4_ = 0;
      }
    }
    else {
      transport_data._4_4_ = 0;
    }
    if (transport_data._4_4_ == 0) {
      changeStateToSubscribeIfAllowed((PMQTTTRANSPORT_HANDLE_DATA)handle);
    }
  }
  return transport_data._4_4_;
}

Assistant:

int IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin(TRANSPORT_LL_HANDLE handle)
{
    int result;
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data == NULL)
    {
        LogError("Invalid handle parameter. NULL.");
        result = MU_FAILURE;
    }
    else
    {
        if (transport_data->topic_GetState == NULL)
        {
            transport_data->topic_GetState = STRING_construct(TOPIC_GET_DESIRED_STATE);
            if (transport_data->topic_GetState == NULL)
            {
                LogError("Failure: unable constructing reported state topic");
                result = MU_FAILURE;
            }
            else
            {
                transport_data->topics_ToSubscribe |= SUBSCRIBE_GET_REPORTED_STATE_TOPIC;
                result = 0;
            }
        }
        else
        {
            result = 0;
        }
        if (result == 0)
        {
            changeStateToSubscribeIfAllowed(transport_data);
        }
    }
    return result;
}